

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::restoreCursorPosition(Private *this)

{
  byte *data;
  String moveCmd;
  String local_30;
  
  if (this->stdoutCursorX != 0) {
    local_30.data = &String::emptyData.super_Data;
    String::printf(&local_30,"\x1b[A\r\x1b[%dC");
    data = (byte *)String::operator_cast_to_char_(&local_30);
    Buffer::append(&this->bufferedOutput,data,(local_30.data)->len);
    String::~String(&local_30);
  }
  return;
}

Assistant:

void restoreCursorPosition()
  {
    if(stdoutCursorX)
    {
#ifdef _MSC_VER
      CONSOLE_SCREEN_BUFFER_INFO csbi;
      VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
      csbi.dwCursorPosition.X = (SHORT)stdoutCursorX;
      --csbi.dwCursorPosition.Y;
      VERIFY(SetConsoleCursorPosition(hOriginalStdOut, csbi.dwCursorPosition));
#else
      String moveCmd;
      moveCmd.printf("\x1b[A\r\x1b[%dC", (int)stdoutCursorX);
      writeConsole(moveCmd, moveCmd.length());
#endif
    }
  }